

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FkLocateIndex(Parse *pParse,Table *pParent,FKey *pFKey,Index **ppIdx,int **paiCol)

{
  uint uVar1;
  char *zRight;
  i16 *piVar2;
  Column *pCVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char **ppcVar7;
  Index *pIVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  int *local_78;
  
  uVar1 = pFKey->nCol;
  lVar5 = (long)(int)uVar1;
  zRight = pFKey->aCol[0].zCol;
  if (lVar5 == 1) {
    if (-1 < (long)pParent->iPKey) {
      if (zRight == (char *)0x0) {
        return 0;
      }
      iVar4 = sqlite3StrICmp(pParent->aCol[pParent->iPKey].zName,zRight);
      if (iVar4 == 0) {
        return 0;
      }
      local_78 = (int *)0x0;
      goto LAB_0024dbe9;
    }
  }
  else if (paiCol != (int **)0x0) {
    local_78 = (int *)sqlite3DbMallocRawNN(pParse->db,lVar5 * 4);
    if (local_78 == (int *)0x0) {
      return 1;
    }
    *paiCol = local_78;
    goto LAB_0024dbe9;
  }
  local_78 = (int *)0x0;
LAB_0024dbe9:
  pIVar8 = pParent->pIndex;
  if (pIVar8 != (Index *)0x0) {
    do {
      if (((uVar1 == pIVar8->nKeyCol) && (pIVar8->onError != '\0')) &&
         (pIVar8->pPartIdxWhere == (Expr *)0x0)) {
        if (zRight == (char *)0x0) {
          if ((pIVar8->field_0x63 & 3) == 2) {
            if (local_78 != (int *)0x0 && 0 < (int)uVar1) {
              lVar6 = 0;
              do {
                *(int *)((long)local_78 + lVar6) = (&pFKey->aCol[0].iFrom)[lVar6];
                lVar6 = lVar6 + 4;
              } while (lVar5 * 4 != lVar6);
            }
LAB_0024dd90:
            *ppIdx = pIVar8;
            return 0;
          }
        }
        else {
          if ((int)uVar1 < 1) {
            uVar11 = 0;
          }
          else {
            piVar2 = pIVar8->aiColumn;
            uVar11 = 0;
            while (lVar6 = (long)piVar2[uVar11], -1 < lVar6) {
              pCVar3 = pParent->aCol;
              pcVar9 = pCVar3[lVar6].zColl;
              if (pcVar9 == (char *)0x0) {
                pcVar9 = "BINARY";
              }
              iVar4 = sqlite3StrICmp(pIVar8->azColl[uVar11],pcVar9);
              if (iVar4 != 0) break;
              pcVar9 = pCVar3[lVar6].zName;
              ppcVar7 = &pFKey->aCol[0].zCol;
              uVar10 = (ulong)uVar1;
              while (iVar4 = sqlite3StrICmp(*ppcVar7,pcVar9), iVar4 != 0) {
                ppcVar7 = ppcVar7 + 2;
                uVar10 = uVar10 - 1;
                if (uVar10 == 0) goto LAB_0024dd01;
              }
              if (local_78 != (int *)0x0) {
                local_78[uVar11] = ((sColMap *)(ppcVar7 + -1))->iFrom;
              }
              if ((int)uVar10 == 0) break;
              uVar11 = uVar11 + 1;
              if (uVar11 == uVar1) goto LAB_0024dd90;
            }
          }
LAB_0024dd01:
          if ((uint)uVar11 == uVar1) goto LAB_0024dd90;
        }
      }
      pIVar8 = pIVar8->pNext;
    } while (pIVar8 != (Index *)0x0);
  }
  if (pParse->disableTriggers == '\0') {
    sqlite3ErrorMsg(pParse,"foreign key mismatch - \"%w\" referencing \"%w\"",pFKey->pFrom->zName,
                    pFKey->zTo);
  }
  if (local_78 != (int *)0x0) {
    sqlite3DbFreeNN(pParse->db,local_78);
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkLocateIndex(
  Parse *pParse,                  /* Parse context to store any error in */
  Table *pParent,                 /* Parent table of FK constraint pFKey */
  FKey *pFKey,                    /* Foreign key to find index for */
  Index **ppIdx,                  /* OUT: Unique index on parent table */
  int **paiCol                    /* OUT: Map of index columns in pFKey */
){
  Index *pIdx = 0;                    /* Value to return via *ppIdx */
  int *aiCol = 0;                     /* Value to return via *paiCol */
  int nCol = pFKey->nCol;             /* Number of columns in parent key */
  char *zKey = pFKey->aCol[0].zCol;   /* Name of left-most parent key column */

  /* The caller is responsible for zeroing output parameters. */
  assert( ppIdx && *ppIdx==0 );
  assert( !paiCol || *paiCol==0 );
  assert( pParse );

  /* If this is a non-composite (single column) foreign key, check if it 
  ** maps to the INTEGER PRIMARY KEY of table pParent. If so, leave *ppIdx 
  ** and *paiCol set to zero and return early. 
  **
  ** Otherwise, for a composite foreign key (more than one column), allocate
  ** space for the aiCol array (returned via output parameter *paiCol).
  ** Non-composite foreign keys do not require the aiCol array.
  */
  if( nCol==1 ){
    /* The FK maps to the IPK if any of the following are true:
    **
    **   1) There is an INTEGER PRIMARY KEY column and the FK is implicitly 
    **      mapped to the primary key of table pParent, or
    **   2) The FK is explicitly mapped to a column declared as INTEGER
    **      PRIMARY KEY.
    */
    if( pParent->iPKey>=0 ){
      if( !zKey ) return 0;
      if( !sqlite3StrICmp(pParent->aCol[pParent->iPKey].zName, zKey) ) return 0;
    }
  }else if( paiCol ){
    assert( nCol>1 );
    aiCol = (int *)sqlite3DbMallocRawNN(pParse->db, nCol*sizeof(int));
    if( !aiCol ) return 1;
    *paiCol = aiCol;
  }

  for(pIdx=pParent->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->nKeyCol==nCol && IsUniqueIndex(pIdx) && pIdx->pPartIdxWhere==0 ){ 
      /* pIdx is a UNIQUE index (or a PRIMARY KEY) and has the right number
      ** of columns. If each indexed column corresponds to a foreign key
      ** column of pFKey, then this index is a winner.  */

      if( zKey==0 ){
        /* If zKey is NULL, then this foreign key is implicitly mapped to 
        ** the PRIMARY KEY of table pParent. The PRIMARY KEY index may be 
        ** identified by the test.  */
        if( IsPrimaryKeyIndex(pIdx) ){
          if( aiCol ){
            int i;
            for(i=0; i<nCol; i++) aiCol[i] = pFKey->aCol[i].iFrom;
          }
          break;
        }
      }else{
        /* If zKey is non-NULL, then this foreign key was declared to
        ** map to an explicit list of columns in table pParent. Check if this
        ** index matches those columns. Also, check that the index uses
        ** the default collation sequences for each column. */
        int i, j;
        for(i=0; i<nCol; i++){
          i16 iCol = pIdx->aiColumn[i];     /* Index of column in parent tbl */
          const char *zDfltColl;            /* Def. collation for column */
          char *zIdxCol;                    /* Name of indexed column */

          if( iCol<0 ) break; /* No foreign keys against expression indexes */

          /* If the index uses a collation sequence that is different from
          ** the default collation sequence for the column, this index is
          ** unusable. Bail out early in this case.  */
          zDfltColl = pParent->aCol[iCol].zColl;
          if( !zDfltColl ) zDfltColl = sqlite3StrBINARY;
          if( sqlite3StrICmp(pIdx->azColl[i], zDfltColl) ) break;

          zIdxCol = pParent->aCol[iCol].zName;
          for(j=0; j<nCol; j++){
            if( sqlite3StrICmp(pFKey->aCol[j].zCol, zIdxCol)==0 ){
              if( aiCol ) aiCol[i] = pFKey->aCol[j].iFrom;
              break;
            }
          }
          if( j==nCol ) break;
        }
        if( i==nCol ) break;      /* pIdx is usable */
      }
    }
  }

  if( !pIdx ){
    if( !pParse->disableTriggers ){
      sqlite3ErrorMsg(pParse,
           "foreign key mismatch - \"%w\" referencing \"%w\"",
           pFKey->pFrom->zName, pFKey->zTo);
    }
    sqlite3DbFree(pParse->db, aiCol);
    return 1;
  }

  *ppIdx = pIdx;
  return 0;
}